

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconengine.cpp
# Opt level: O2

QPixmap * __thiscall
QAbstractFileIconEngine::scaledPixmap
          (QPixmap *__return_storage_ptr__,QAbstractFileIconEngine *this,QSize *size,Mode mode,
          State state,qreal scale)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QStringBuilder<char16_t,_QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((size->wd).m_i < 0) || ((size->ht).m_i < 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00250cb2;
    QPixmap::QPixmap(__return_storage_ptr__);
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d._0_4_ = 0xaaaaaaaa;
    local_58.d._4_4_ = 0xaaaaaaaa;
    local_58.ptr._0_4_ = 0xaaaaaaaa;
    local_58.ptr._4_4_ = 0xaaaaaaaa;
    (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x11])(&local_58);
    if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
      local_78._0_8_ = operator*(size,scale);
      (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x10])
                (__return_storage_ptr__,this,(QSize *)&local_78,(ulong)mode,state);
    }
    else {
      QString::number((double)(size->wd).m_i * scale,(char)&local_98,0x67);
      local_78.b.d.size = local_98.size;
      local_78.b.d.ptr = local_98.ptr;
      local_78.b.d.d = local_98.d;
      local_78.a = 0x5f;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      ::operator+=((QString *)&local_58,&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78.b);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      (__return_storage_ptr__->data).d.ptr = (QPlatformPixmap *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->super_QPaintDevice)._vptr_QPaintDevice =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(__return_storage_ptr__->super_QPaintDevice).painters = &DAT_aaaaaaaaaaaaaaaa
      ;
      QPixmap::QPixmap(__return_storage_ptr__);
      bVar1 = QPixmapCache::find((QString *)&local_58,__return_storage_ptr__);
      if (!bVar1) {
        local_98.d = (Data *)operator*(size,scale);
        (*(this->super_QPixmapIconEngine).super_QIconEngine._vptr_QIconEngine[0x10])
                  ((QPixmap *)&local_78,this,&local_98,(ulong)mode,(ulong)state);
        QPixmap::operator=(__return_storage_ptr__,(QPixmap *)&local_78);
        QPixmap::~QPixmap((QPixmap *)&local_78);
        bVar1 = QPixmap::isNull(__return_storage_ptr__);
        if (!bVar1) {
          QPixmapCache::insert((QString *)&local_58,__return_storage_ptr__);
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_00250cb2:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QPixmap QAbstractFileIconEngine::scaledPixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    if (!size.isValid())
        return QPixmap();

    QString key = cacheKey();
    if (key.isEmpty())
        return filePixmap(size * scale, mode, state);

    key += u'_' + QString::number(size.width() * scale);

    QPixmap result;
    if (!QPixmapCache::find(key, &result)) {
        result = filePixmap(size * scale, mode, state);
        if (!result.isNull())
            QPixmapCache::insert(key, result);
    }

    return result;
}